

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O3

void __thiscall adios2::core::Group::Group(Group *this,string *path,char delimiter,IO *io)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  TreeMap *__p;
  _Rb_tree_header *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  (this->currentPath)._M_dataplus._M_p = (pointer)&(this->currentPath).field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + path->_M_string_length);
  this->groupDelimiter = delimiter;
  (this->mapPtr).super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->mapPtr).super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ADIOS_root)._M_dataplus._M_p = (pointer)&(this->ADIOS_root).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->ADIOS_root,"_ADIOS_ROOT_","");
  (this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_IO = io;
  if ((this->mapPtr).super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    __p = (TreeMap *)operator_new(0x30);
    p_Var3 = &(__p->treeMap)._M_t._M_impl.super__Rb_tree_header;
    (__p->treeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->treeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(undefined8 *)&(__p->treeMap)._M_t._M_impl = 0;
    *(undefined8 *)&(__p->treeMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (__p->treeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    (__p->treeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    (__p->treeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<adios2::core::Group::TreeMap*>
              (a_Stack_40,__p);
    _Var2._M_pi = a_Stack_40[0]._M_pi;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->mapPtr).
              super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->mapPtr).super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = __p;
    (this->mapPtr).super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
      }
    }
  }
  return;
}

Assistant:

Group::Group(std::string path, char delimiter, IO &io)
: currentPath(path), groupDelimiter(delimiter), m_IO(io)
{
    if (mapPtr == nullptr)
    {
        mapPtr = std::shared_ptr<TreeMap>(new TreeMap());
    }
}